

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::PathTypeHandlerBase::SetWritable
          (PathTypeHandlerBase *this,DynamicObject *instance,PropertyId propertyId,BOOL value)

{
  int *piVar1;
  Type TVar2;
  bool bVar3;
  PropertyIndex propertyIndex;
  int iVar4;
  BOOL BVar5;
  DynamicTypeHandler *pDVar6;
  PropertyRecord *pPVar7;
  undefined4 extraout_var;
  
  BVar5 = 1;
  if (value == 0) {
    bVar3 = Phases::IsEnabled((Phases *)&DAT_015bbe90,ShareTypesWithAttributesPhase);
    if (bVar3) {
      piVar1 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                 super_JavascriptLibraryBase).scriptContext.ptr)->
                convertPathToDictionaryAttributesCount;
      *piVar1 = *piVar1 + 1;
      pDVar6 = TryConvertToSimpleDictionaryType<Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>>
                         (this,instance,(uint)((this->super_DynamicTypeHandler).unusedBytes >> 1),
                          false);
      iVar4 = (*pDVar6->_vptr_DynamicTypeHandler[0x2a])
                        (pDVar6,instance,(ulong)(uint)propertyId,0,
                         pDVar6->_vptr_DynamicTypeHandler[0x2a]);
      return iVar4;
    }
    propertyIndex =
         TypePath::LookupInline
                   ((this->typePath).ptr,propertyId,
                    (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1));
    if (propertyIndex == 0xffff) {
      bVar3 = DynamicObject::HasObjectArray(instance);
      if (bVar3) {
        pPVar7 = ScriptContext::GetPropertyName
                           ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr
                             )->super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
        TVar2 = pPVar7->isNumeric;
        if (TVar2 == true) {
          iVar4 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x48])(this,instance);
          pPVar7 = (PropertyRecord *)
                   (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x150))
                             ((long *)CONCAT44(extraout_var,iVar4),instance,propertyId,0);
        }
        if (TVar2 != false) {
          return (BOOL)pPVar7;
        }
      }
      BVar5 = 1;
    }
    else {
      BVar5 = SetAttributesHelper(this,instance,propertyId,propertyIndex,(ObjectSlotAttributes *)0x0
                                  ,ObjectSlotAttr_Configurable|ObjectSlotAttr_Enumerable,false);
    }
  }
  return BVar5;
}

Assistant:

BOOL PathTypeHandlerBase::SetWritable(DynamicObject* instance, PropertyId propertyId, BOOL value)
    {
        if (value)
        {
            return true;
        }

        if (PHASE_OFF1(ShareTypesWithAttributesPhase))
        {
#ifdef PROFILE_TYPES
            instance->GetScriptContext()->convertPathToDictionaryAttributesCount++;
#endif
            return TryConvertToSimpleDictionaryType(instance, GetPathLength())->SetWritable(instance, propertyId, value);
        }

        // Find the property
        PropertyIndex propertyIndex = GetTypePath()->LookupInline(propertyId, GetPathLength());
        if (propertyIndex == Constants::NoSlot)
        {
            // Upgrade type handler if set objectArray item attribute.
            // Only check numeric propertyId if objectArray available.
            if (instance->HasObjectArray())
            {
                PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
                if (propertyRecord->IsNumeric())
                {
                    return ConvertToTypeWithItemAttributes(instance)->SetWritable(instance, propertyId, value);
                }
            }
            return true;
        }

        return SetAttributesHelper(instance, propertyId, propertyIndex, nullptr, (ObjectSlotAttributes)(ObjectSlotAttr_Default & ~ObjectSlotAttr_Writable));
    }